

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O2

void sdefl_heap_sub(uint *A,uint len,uint sub)

{
  uint uVar1;
  uint uVar2;
  uint p;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = A[sub];
  uVar3 = (ulong)sub;
  while( true ) {
    uVar2 = (int)uVar3 * 2;
    uVar4 = (ulong)uVar2;
    if (len < uVar2) break;
    if ((uVar2 < len) && (uVar4 = (ulong)(uVar2 | 1), A[uVar4] <= A[uVar2])) {
      uVar4 = (ulong)uVar2;
    }
    if (A[uVar4] <= uVar1) break;
    A[uVar3] = A[uVar4];
    uVar3 = uVar4;
  }
  A[uVar3] = uVar1;
  return;
}

Assistant:

static void
sdefl_heap_sub(unsigned A[], unsigned len, unsigned sub) {
  unsigned c, p = sub;
  unsigned v = A[sub];
  while ((c = p << 1) <= len) {
    if (c < len && A[c + 1] > A[c]) c++;
    if (v >= A[c]) break;
    A[p] = A[c], p = c;
  }
  A[p] = v;
}